

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::LiteTest_DownCastMessageInvalidPointerType_Test::TestBody
          (LiteTest_DownCastMessageInvalidPointerType_Test *this)

{
  bool bVar1;
  DeathTest *pDVar2;
  DeathTest *pDVar3;
  bool bVar4;
  int iVar5;
  char *message;
  StringLike<std::__cxx11::basic_string<char>_> *regex;
  AlphaNum *in_R9;
  DeathTest *gtest_dt;
  CastType1 test_type_1;
  DeathTest *local_490;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_488;
  char *local_480;
  string local_458;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_438;
  PolymorphicMatcher<testing::internal::MatchesRegexMatcher> local_420;
  AlphaNum local_408;
  AlphaNum local_3d8;
  AlphaNum local_3a8;
  TestAllTypesLite local_378;
  
  proto2_unittest::TestAllTypesLite::TestAllTypesLite(&local_378,(Arena *)0x0);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    local_488._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10;
    local_480 = "Cannot downcast ";
    local_408.piece_ = MessageLite::GetTypeName(&local_378.super_MessageLite);
    local_3d8.piece_._M_len = 4;
    local_3d8.piece_._M_str = " to ";
    local_3a8.piece_ =
         MessageLite::GetTypeName
                   ((MessageLite *)&proto2_unittest::_TestPackedTypesLite_default_instance_);
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_458,(lts_20250127 *)&local_488,&local_408,&local_3d8,&local_3a8,in_R9);
    testing::ContainsRegex<std::__cxx11::string>(&local_420,(testing *)&local_458,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_438,(PolymorphicMatcher *)&local_420);
    if (local_420.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_420.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar4 = testing::internal::DeathTest::Create
                      ("DownCastMessage<CastType2>(test_type_1_pointer)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_438,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
                       ,0x5a6,&local_490);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
    }
    pDVar2 = local_490;
    bVar1 = true;
    if (bVar4) {
      if (local_490 != (DeathTest *)0x0) {
        iVar5 = (*local_490->_vptr_DeathTest[2])(local_490);
        pDVar3 = local_490;
        if (iVar5 == 0) {
          iVar5 = (*local_490->_vptr_DeathTest[3])(local_490);
          bVar4 = testing::internal::ExitedUnsuccessfully(iVar5);
          iVar5 = (*local_490->_vptr_DeathTest[4])(local_490,(ulong)bVar4);
          if ((char)iVar5 != '\0') goto LAB_00168a41;
          bVar1 = true;
          bVar4 = false;
        }
        else {
          if (iVar5 == 1) {
            bVar4 = testing::internal::AlwaysTrue();
            if (bVar4) {
              DownCastMessage<proto2_unittest::TestPackedTypesLite>(&local_378.super_MessageLite);
            }
            (*local_490->_vptr_DeathTest[5])(local_490,2);
            (*pDVar3->_vptr_DeathTest[5])(pDVar3,0);
          }
LAB_00168a41:
          bVar1 = false;
          bVar4 = true;
        }
        (*pDVar2->_vptr_DeathTest[1])(pDVar2);
        if (!bVar4) goto LAB_00168a56;
      }
      bVar1 = false;
    }
LAB_00168a56:
    if (!bVar1) goto LAB_00168aba;
  }
  testing::Message::Message((Message *)&local_488);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_408,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/lite_unittest.cc"
             ,0x5a6,message);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_408,(Message *)&local_488);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_408);
  if (local_488._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_488._M_head_impl + 8))();
  }
LAB_00168aba:
  proto2_unittest::TestAllTypesLite::~TestAllTypesLite(&local_378);
  return;
}

Assistant:

TEST(LiteTest, DownCastMessageInvalidPointerType) {
  CastType1 test_type_1;

  MessageLite* test_type_1_pointer = &test_type_1;

  ASSERT_DEBUG_DEATH(
      DownCastMessage<CastType2>(test_type_1_pointer),
      absl::StrCat("Cannot downcast ", test_type_1.GetTypeName(), " to ",
                   CastType2::default_instance().GetTypeName()));
}